

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::Payload>
          (AsciiParser *this,vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *result)

{
  bool bVar1;
  char c;
  bool triple_deliminated;
  char ce;
  
  bVar1 = SkipWhitespace(this);
  if ((bVar1) && (bVar1 = Char1(this,&c), bVar1)) {
    if (c == '[') {
      bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (bVar1) {
        bVar1 = Char1(this,&ce);
        if (!bVar1) {
          return bVar1;
        }
        if (ce == ']') {
          ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear(result);
          return bVar1;
        }
        Rewind(this,1);
        bVar1 = SepBy1BasicType<tinyusdz::Payload>(this,',',']',result);
        if (((bVar1) && (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)) &&
           (bVar1 = Expect(this,']'), bVar1)) {
          return true;
        }
      }
    }
    else {
      Rewind(this,1);
      Payload::Payload((Payload *)&ce);
      triple_deliminated = false;
      bVar1 = ParsePayload(this,(Payload *)&ce,&triple_deliminated);
      if (bVar1) {
        ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear(result);
        ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::push_back
                  (result,(Payload *)&ce);
        Payload::~Payload((Payload *)&ce);
        return true;
      }
      Payload::~Payload((Payload *)&ce);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<Payload> *result) {
  if (!SkipWhitespace()) {
    return false;
  }

  char c;
  if (!Char1(&c)) {
    return false;
  }

  if (c != '[') {
    Rewind(1);

    DCOUT("Guess non-list version");
    // Guess non-list version
    Payload pl;
    bool triple_deliminated{false};
    if (!ParsePayload(&pl, &triple_deliminated)) {
      return false;
    }

    (void)triple_deliminated;
    result->clear();
    result->push_back(pl);

  } else {

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // Empty array?
    {
      char ce;
      if (!Char1(&ce)) {
        return false;
      }

      if (ce == ']') {
        result->clear();
        return true;
      }

      Rewind(1);
    }

    if (!SepBy1BasicType(',', ']', result)) {
      return false;
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    if (!Expect(']')) {
      return false;
    }
  }

  return true;
}